

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

oonf_layer2_neigh *
dlep_session_get_local_l2_neighbor(dlep_session *session,oonf_layer2_neigh_key *key)

{
  undefined4 uVar1;
  char *pcVar2;
  avl_tree *paVar3;
  char *pcVar4;
  oonf_layer2_net *local_1a8;
  long local_1a0;
  oonf_layer2_neigh *local_190;
  undefined1 local_186 [8];
  oonf_layer2_neigh_key_str nbuf2;
  oonf_layer2_neigh_key_str nbuf1;
  oonf_layer2_net *l2net;
  oonf_layer2_neigh *l2neigh;
  dlep_local_neighbor *dlep_neigh;
  oonf_layer2_neigh_key *key_local;
  dlep_session *session_local;
  undefined4 local_90;
  uint local_8c;
  undefined *local_88;
  undefined4 local_80;
  uint local_7c;
  undefined *local_78;
  undefined4 local_70;
  uint local_6c;
  undefined *local_68;
  oonf_layer2_neigh_key *local_60;
  dlep_session *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  long local_40;
  undefined8 local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  dlep_neigh = (dlep_local_neighbor *)key;
  key_local = (oonf_layer2_neigh_key *)session;
  local_60 = key;
  local_58 = session;
  local_10 = avl_find(&session->local_neighbor_tree,key);
  local_18 = 0xe0;
  if (local_10 == 0) {
    local_190 = (oonf_layer2_neigh *)0x0;
  }
  else {
    local_190 = (oonf_layer2_neigh *)(local_10 + -0xe0);
  }
  l2neigh = local_190;
  if (local_190 == (oonf_layer2_neigh *)0x0) {
    local_6c = *(uint *)(key_local[8].link_id + 5);
    local_68 = &log_global_mask;
    local_70 = 2;
    if (((&log_global_mask)[local_6c] & 2) != 0) {
      uVar1 = *(undefined4 *)(key_local[8].link_id + 5);
      pcVar2 = oonf_layer2_neigh_key_to_string
                         ((oonf_layer2_neigh_key_str *)(nbuf2.buf + 0x5b),&dlep_neigh->key,true);
      oonf_log(2,uVar1,"src/generic/dlep/dlep_session.c",0x204,0,0,
               "Could not find local neighbor for %s",pcVar2);
    }
    session_local = (dlep_session *)0x0;
  }
  else {
    local_50 = *(undefined8 *)(key_local[8].link_id + 0xd);
    paVar3 = oonf_layer2_get_net_tree();
    local_20 = avl_find(paVar3,local_50);
    local_28 = 0x7a0;
    if (local_20 == 0) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = local_20 + -0x7a0;
    }
    nbuf1._91_8_ = local_1a0;
    if (local_1a0 == 0) {
      local_7c = *(uint *)(key_local[8].link_id + 5);
      local_78 = &log_global_mask;
      local_80 = 1;
      if (((&log_global_mask)[local_7c] & 1) != 0) {
        oonf_log(1,*(undefined4 *)(key_local[8].link_id + 5),"src/generic/dlep/dlep_session.c",0x20a
                 ,0,0,"Could not find l2net %s for new neighbor",
                 *(undefined8 *)(key_local[8].link_id + 0xd));
      }
      session_local = (dlep_session *)0x0;
    }
    else {
      local_48 = (undefined1 *)((long)&l2neigh->network + 2);
      local_40 = local_1a0;
      local_30 = avl_find(local_1a0 + 0x90,local_48);
      local_38 = 0x4c0;
      if (local_30 == 0) {
        local_1a8 = (oonf_layer2_net *)0x0;
      }
      else {
        local_1a8 = (oonf_layer2_net *)(local_30 + -0x4c0);
      }
      l2net = local_1a8;
      if (local_1a8 == (oonf_layer2_net *)0x0) {
        local_8c = *(uint *)(key_local[8].link_id + 5);
        local_88 = &log_global_mask;
        local_90 = 2;
        if (((&log_global_mask)[local_8c] & 2) != 0) {
          uVar1 = *(undefined4 *)(key_local[8].link_id + 5);
          pcVar2 = oonf_layer2_neigh_key_to_string
                             ((oonf_layer2_neigh_key_str *)(nbuf2.buf + 0x5b),&dlep_neigh->key,true)
          ;
          pcVar4 = oonf_layer2_neigh_key_to_string
                             ((oonf_layer2_neigh_key_str *)local_186,
                              (oonf_layer2_neigh_key *)((long)&l2neigh->network + 2),true);
          oonf_log(2,uVar1,"src/generic/dlep/dlep_session.c",0x213,0,0,
                   "Could not find l2neigh for neighbor %s (%s)",pcVar2,pcVar4);
        }
        session_local = (dlep_session *)0x0;
      }
      else {
        session_local = (dlep_session *)local_1a8;
      }
    }
  }
  return (oonf_layer2_neigh *)session_local;
}

Assistant:

struct oonf_layer2_neigh *
dlep_session_get_local_l2_neighbor(struct dlep_session *session, const struct oonf_layer2_neigh_key *key) {
  struct dlep_local_neighbor *dlep_neigh;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
#ifdef OONF_LOG_INFO
  union oonf_layer2_neigh_key_str nbuf1, nbuf2;
#endif

  dlep_neigh = dlep_session_get_local_neighbor(session, key);
  if (!dlep_neigh) {
    OONF_INFO(session->log_source, "Could not find local neighbor for %s",
              oonf_layer2_neigh_key_to_string(&nbuf1, key, true));
    return NULL;
  }

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    OONF_DEBUG(session->log_source, "Could not find l2net %s for new neighbor", session->l2_listener.name);
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, &dlep_neigh->neigh_key);
  if (!l2neigh) {
    OONF_INFO(session->log_source,
      "Could not find l2neigh for neighbor %s (%s)",
      oonf_layer2_neigh_key_to_string(&nbuf1, key, true),
      oonf_layer2_neigh_key_to_string(&nbuf2, &dlep_neigh->neigh_key, true));
    return NULL;
  }
  return l2neigh;
}